

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::shlSlowCase(APInt *this,uint ShiftAmt)

{
  WordType *Dst;
  uint Words;
  uint ShiftAmt_local;
  APInt *this_local;
  
  Dst = (this->U).pVal;
  Words = getNumWords(this);
  tcShiftLeft(Dst,Words,ShiftAmt);
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::shlSlowCase(unsigned ShiftAmt) {
  tcShiftLeft(U.pVal, getNumWords(), ShiftAmt);
  clearUnusedBits();
}